

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O0

void __thiscall psy::C::SemanticModelTester::case0300(SemanticModelTester *this)

{
  SemanticModel *this_00;
  bool bVar1;
  SyntaxKind SVar2;
  ostream *poVar3;
  void *pvVar4;
  undefined8 uVar5;
  StructOrUnionDeclarationSyntax *node;
  TagType *pTVar6;
  Lexeme *pLVar7;
  string local_d8;
  string local_b8;
  TagDeclarationSymbol *local_98;
  StructDeclarationSymbol *strukt;
  type *semaModel;
  type *tyDeclNode;
  string local_78 [55];
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [24];
  SemanticModelTester *this_local;
  
  local_20._16_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"struct x { int _ ; } ;",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"",(allocator<char> *)((long)&tyDeclNode + 7));
  compile<psy::C::StructOrUnionDeclarationSyntax>
            ((SemanticModelTester *)local_20,(string *)this,&local_40);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tyDeclNode + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  semaModel = (type *)std::
                      get<0ul,psy::C::StructOrUnionDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                                ((tuple<const_psy::C::StructOrUnionDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                                  *)local_20);
  strukt = (StructDeclarationSymbol *)
           std::get<1ul,psy::C::StructOrUnionDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                     ((tuple<const_psy::C::StructOrUnionDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                       *)local_20);
  SVar2 = C::SyntaxNode::kind((SyntaxNode *)*semaModel);
  if (SVar2 != StructDeclaration) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar3 = std::operator<<(poVar3,"\t\tActual  : ");
    SVar2 = C::SyntaxNode::kind((SyntaxNode *)*semaModel);
    poVar3 = C::operator<<(poVar3,SVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\t\tExpected: ");
    poVar3 = C::operator<<(poVar3,StructDeclaration);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\t\t");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,0x1cb);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    uVar5 = __cxa_allocate_exception(1);
    __cxa_throw(uVar5,&TestFailed::typeinfo,0);
  }
  this_00 = (SemanticModel *)
            (strukt->super_StructOrUnionDeclarationSymbol).super_TagDeclarationSymbol.
            super_TypeDeclarationSymbol.super_DeclarationSymbol.super_Symbol._vptr_Symbol;
  node = StructOrUnionDeclarationSyntax::asStructOrUnionDeclaration
                   ((StructOrUnionDeclarationSyntax *)*semaModel);
  local_98 = (TagDeclarationSymbol *)SemanticModel::structFor(this_00,node);
  if (local_98 == (TagDeclarationSymbol *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar3 = std::operator<<(poVar3,"\t\tExpression is NOT ");
    poVar3 = std::operator<<(poVar3,"true");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\t\t");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,0x1cd);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    uVar5 = __cxa_allocate_exception(1);
    __cxa_throw(uVar5,&TestFailed::typeinfo,0);
  }
  pTVar6 = TagDeclarationSymbol::introducedNewType(local_98);
  pLVar7 = &TagType::tag(pTVar6)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_b8,pLVar7);
  bVar1 = std::operator==(&local_b8,"x");
  std::__cxx11::string::~string((string *)&local_b8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
  poVar3 = std::operator<<(poVar3,"\t\tActual  : ");
  pTVar6 = TagDeclarationSymbol::introducedNewType(local_98);
  pLVar7 = &TagType::tag(pTVar6)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_d8,pLVar7);
  poVar3 = std::operator<<(poVar3,(string *)&local_d8);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\t\tExpected: ");
  poVar3 = std::operator<<(poVar3,"x");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,0x1ce);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_d8);
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0300()
{
    auto [tyDeclNode, semaModel] =
            compile<StructOrUnionDeclarationSyntax>("struct x { int _ ; } ;");

    PSY_EXPECT_EQ_ENU(tyDeclNode->kind(), SyntaxKind::StructDeclaration, SyntaxKind);
    const StructDeclarationSymbol* strukt = semaModel->structFor(tyDeclNode->asStructOrUnionDeclaration());
    PSY_EXPECT_TRUE(strukt);
    PSY_EXPECT_EQ_STR(strukt->introducedNewType()->tag()->valueText(), "x");
}